

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_brcondi_i32_sparc64
               (TCGContext_conflict8 *tcg_ctx,TCGCond cond,TCGv_i32 arg1,int32_t arg2,TCGLabel *l)

{
  TCGv_i32 arg2_00;
  TCGv_i32 t0;
  TCGLabel *l_local;
  int32_t arg2_local;
  TCGv_i32 arg1_local;
  TCGCond cond_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  if (cond == TCG_COND_ALWAYS) {
    tcg_gen_br(tcg_ctx,l);
  }
  else if (cond != TCG_COND_NEVER) {
    arg2_00 = tcg_const_i32_sparc64(tcg_ctx,arg2);
    tcg_gen_brcond_i32_sparc64(tcg_ctx,cond,arg1,arg2_00,l);
    tcg_temp_free_i32(tcg_ctx,arg2_00);
  }
  return;
}

Assistant:

void tcg_gen_brcondi_i32(TCGContext *tcg_ctx, TCGCond cond, TCGv_i32 arg1, int32_t arg2, TCGLabel *l)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_br(tcg_ctx, l);
    } else if (cond != TCG_COND_NEVER) {
        TCGv_i32 t0 = tcg_const_i32(tcg_ctx, arg2);
        tcg_gen_brcond_i32(tcg_ctx, cond, arg1, t0, l);
        tcg_temp_free_i32(tcg_ctx, t0);
    }
}